

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int server_finish_handshake
              (ptls_t *tls,ptls_message_emitter_t *emitter,int send_cert_verify,
              st_ptls_signature_algorithms_t *signature_algorithms)

{
  ptls_key_schedule_t *sched;
  int iVar1;
  ptls_iovec_t ikm;
  byte local_41;
  uint8_t i;
  int local_2c;
  int ret;
  st_ptls_signature_algorithms_t *signature_algorithms_local;
  int send_cert_verify_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  
  if ((send_cert_verify == 0) ||
     (local_2c = send_certificate_verify
                           (tls,emitter,signature_algorithms,"TLS 1.3, server CertificateVerify"),
     local_2c == 0)) {
    local_2c = send_finished(tls,emitter);
    if (local_2c == 0) {
      if (tls->key_schedule->generation != 2) {
        __assert_fail("tls->key_schedule->generation == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x1336,
                      "int server_finish_handshake(ptls_t *, ptls_message_emitter_t *, int, struct st_ptls_signature_algorithms_t *)"
                     );
      }
      sched = tls->key_schedule;
      ikm = ptls_iovec_init((void *)0x0,0);
      local_2c = key_schedule_extract(sched,ikm);
      if ((((local_2c == 0) &&
           (local_2c = setup_traffic_protection(tls,1,"s ap traffic",3,0,0), local_2c == 0)) &&
          (local_2c = derive_secret(tls->key_schedule,&tls->field_19,"c ap traffic"), local_2c == 0)
          ) && (local_2c = derive_exporter_secret(tls,0), local_2c == 0)) {
        if (tls->pending_handshake_secret == (uint8_t *)0x0) {
          if (((byte)tls->ctx->field_0xb8 >> 3 & 1) == 0) {
            tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
          }
          else {
            tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
          }
        }
        else if (((byte)tls->ctx->field_0xb8 >> 4 & 1) == 0) {
          tls->state = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
        }
        else {
          iVar1 = commission_handshake_secret(tls);
          if (iVar1 != 0) {
            return iVar1;
          }
          tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
        }
        if ((tls->field_19).server.num_tickets_to_send != '\0') {
          if (tls->ctx->ticket_lifetime == 0) {
            __assert_fail("tls->ctx->ticket_lifetime != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                          ,0x1350,
                          "int server_finish_handshake(ptls_t *, ptls_message_emitter_t *, int, struct st_ptls_signature_algorithms_t *)"
                         );
          }
          for (local_41 = 0; local_41 < (tls->field_19).server.num_tickets_to_send;
              local_41 = local_41 + 1) {
            iVar1 = send_session_ticket(tls,emitter);
            if (iVar1 != 0) {
              return iVar1;
            }
          }
        }
        if (((byte)tls->ctx->field_0xb8 >> 3 & 1) == 0) {
          local_2c = 0;
        }
        else {
          local_2c = 0x202;
        }
      }
    }
  }
  else if (local_2c == 0x20b) {
    tls->state = PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY;
  }
  return local_2c;
}

Assistant:

static int server_finish_handshake(ptls_t *tls, ptls_message_emitter_t *emitter, int send_cert_verify,
                                   struct st_ptls_signature_algorithms_t *signature_algorithms)
{
    int ret;

    if (send_cert_verify) {
        if ((ret = send_certificate_verify(tls, emitter, signature_algorithms, PTLS_SERVER_CERTIFICATE_VERIFY_CONTEXT_STRING)) !=
            0) {
            if (ret == PTLS_ERROR_ASYNC_OPERATION) {
                tls->state = PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY;
            }
            goto Exit;
        }
    }

    if ((ret = send_finished(tls, emitter)) != 0)
        goto Exit;

    assert(tls->key_schedule->generation == 2);
    if ((ret = key_schedule_extract(tls->key_schedule, ptls_iovec_init(NULL, 0))) != 0)
        goto Exit;
    if ((ret = setup_traffic_protection(tls, 1, "s ap traffic", 3, 0, 0)) != 0)
        goto Exit;
    if ((ret = derive_secret(tls->key_schedule, tls->server.pending_traffic_secret, "c ap traffic")) != 0)
        goto Exit;
    if ((ret = derive_exporter_secret(tls, 0)) != 0)
        goto Exit;

    if (tls->pending_handshake_secret != NULL) {
        if (tls->ctx->omit_end_of_early_data) {
            if ((ret = commission_handshake_secret(tls)) != 0)
                goto Exit;
            tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
        } else {
            tls->state = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
        }
    } else if (tls->ctx->require_client_authentication) {
        tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
    } else {
        tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
    }

    /* send session ticket if necessary */
    if (tls->server.num_tickets_to_send != 0) {
        assert(tls->ctx->ticket_lifetime != 0);
        for (uint8_t i = 0; i < tls->server.num_tickets_to_send; ++i)
            if ((ret = send_session_ticket(tls, emitter)) != 0)
                goto Exit;
    }

    if (tls->ctx->require_client_authentication) {
        ret = PTLS_ERROR_IN_PROGRESS;
    } else {
        ret = 0;
    }

Exit:
    return ret;
}